

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_function-c.cpp
# Opt level: O2

duckdb_scalar_function_set duckdb_create_scalar_function_set(char *name)

{
  duckdb_scalar_function_set this;
  allocator local_31;
  string local_30;
  
  if ((name == (char *)0x0) || (*name == '\0')) {
    this = (duckdb_scalar_function_set)0x0;
  }
  else {
    this = (duckdb_scalar_function_set)operator_new(0x38);
    std::__cxx11::string::string((string *)&local_30,name,&local_31);
    duckdb::ScalarFunctionSet::ScalarFunctionSet((ScalarFunctionSet *)this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return this;
}

Assistant:

duckdb_scalar_function_set duckdb_create_scalar_function_set(const char *name) {
	if (!name || !*name) {
		return nullptr;
	}
	auto function = new duckdb::ScalarFunctionSet(name);
	return reinterpret_cast<duckdb_scalar_function_set>(function);
}